

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O0

bool __thiscall
helics::NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1>::
brokerConnect(NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1> *this)

{
  milliseconds timeOut;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  milliseconds mVar5;
  CommsInterface *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  CoreBroker *in_RDI;
  bool res;
  lock_guard<std::mutex> lock;
  CommsInterface *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
             ,(mutex_type *)in_stack_ffffffffffffff98);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4aad05);
  if ((bVar1) &&
     (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4aad20),
     bVar1)) {
    CoreBroker::setAsRoot
              ((CoreBroker *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  }
  in_RDI[1].super_BrokerBase.actionQueue.m_pushLock.super___mutex_base._M_mutex.__size[10] =
       (in_RDI->super_BrokerBase).useJsonSerialization & 1;
  in_RDI[1].super_BrokerBase.actionQueue.m_pushLock.super___mutex_base._M_mutex.__size[0xb] =
       (in_RDI->super_BrokerBase).observer & 1;
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4aad7e);
  CoreBroker::getIdentifier_abi_cxx11_(in_RDI);
  CommsInterface::setName
            ((CommsInterface *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (string *)in_stack_ffffffffffffff98);
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4aadad);
  zeromq::ZmqComms::loadNetworkInfo
            ((ZmqComms *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (NetworkBrokerData *)in_stack_ffffffffffffff98);
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4aadd4);
  mVar5 = TimeRepresentation<count_time<9,_long>_>::to_ms
                    ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff98);
  iVar4 = (int)mVar5.__r;
  timeOut.__r._7_1_ = in_stack_ffffffffffffffa7;
  timeOut.__r._0_7_ = in_stack_ffffffffffffffa0;
  CommsInterface::setTimeout(in_stack_ffffffffffffff98,timeOut);
  this_00 = (CommsInterface *)
            CLI::std::
            unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
            operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>
                        *)0x4aae1a);
  uVar3 = CommsInterface::connect(this_00,iVar4,__addr,in_ECX);
  bVar2 = (byte)uVar3 & 1;
  if (((uVar3 & 1) != 0) &&
     (iVar4._0_1_ = in_RDI[1].super_BrokerBase.disableDynamicSources,
     iVar4._1_1_ = in_RDI[1].super_BrokerBase.mainLoopIsRunning,
     iVar4._2_1_ = in_RDI[1].super_BrokerBase.dumplog,
     iVar4._3_1_ = in_RDI[1].super_BrokerBase.queueDisabled, iVar4 < 0)) {
    CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
    operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>
                *)0x4aae58);
    iVar4 = NetworkCommsInterface::getPort((NetworkCommsInterface *)0x4aae60);
    in_RDI[1].super_BrokerBase.disableDynamicSources = (bool)(char)iVar4;
    in_RDI[1].super_BrokerBase.mainLoopIsRunning = (atomic<bool>)(char)((uint)iVar4 >> 8);
    in_RDI[1].super_BrokerBase.dumplog = (bool)(char)((uint)iVar4 >> 0x10);
    in_RDI[1].super_BrokerBase.queueDisabled = (bool)(char)((uint)iVar4 >> 0x18);
  }
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4aae89);
  return (bool)(bVar2 & 1);
}

Assistant:

bool NetworkBroker<COMMS, baseline, tcode>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
        CoreBroker::setAsRoot();
    }
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CoreBroker>::comms->setName(CoreBroker::getIdentifier());
    CommsBroker<COMMS, CoreBroker>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CoreBroker>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());

    auto res = CommsBroker<COMMS, CoreBroker>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CoreBroker>::comms->getPort();
        }
    }
    return res;
}